

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ReadBasicType
          (AsciiParser *this,optional<std::array<tinyusdz::value::half,_3UL>_> *value)

{
  bool bVar1;
  uint7 in_register_00000001;
  half3 v;
  undefined8 uStack_18;
  
  uStack_18 = (ulong)in_register_00000001 << 8;
  bVar1 = MaybeNone(this);
  if (bVar1) {
    value->has_value_ = false;
    bVar1 = true;
  }
  else {
    bVar1 = ReadBasicType(this,(half3 *)((long)&uStack_18 + 2));
    if (bVar1) {
      *(undefined4 *)&value->contained = uStack_18._2_4_;
      *(undefined2 *)((long)&value->contained + 4) = uStack_18._6_2_;
      if (value->has_value_ == false) {
        value->has_value_ = true;
      }
    }
  }
  return bVar1;
}

Assistant:

bool AsciiParser::ReadBasicType(nonstd::optional<value::half3> *value) {
  if (MaybeNone()) {
    (*value) = nonstd::nullopt;
    return true;
  }

  value::half3 v;
  if (ReadBasicType(&v)) {
    (*value) = v;
    return true;
  }

  return false;
}